

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O1

mp_int * mp_random_upto_fn(mp_int *limit,random_read_fn_t rf)

{
  mp_int *n;
  mp_int *r_out;
  
  n = mp_random_bits_fn(limit->nw * 0x40 + 0x80,rf);
  r_out = mp_make_sized(limit->nw);
  mp_divmod_into(n,limit,(mp_int *)0x0,r_out);
  mp_free(n);
  return r_out;
}

Assistant:

mp_int *mp_random_upto_fn(mp_int *limit, random_read_fn_t rf)
{
    /*
     * It would be nice to generate our random numbers in such a way
     * as to make every possible outcome literally equiprobable. But
     * we can't do that in constant time, so we have to go for a very
     * close approximation instead. I'm going to take the view that a
     * factor of (1+2^-128) between the probabilities of two outcomes
     * is acceptable on the grounds that you'd have to examine so many
     * outputs to even detect it.
     */
    mp_int *unreduced = mp_random_bits_fn(mp_max_bits(limit) + 128, rf);
    mp_int *reduced = mp_mod(unreduced, limit);
    mp_free(unreduced);
    return reduced;
}